

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O2

REF_STATUS ref_smooth_tet_nso(REF_GRID ref_grid,REF_INT node)

{
  REF_ADJ pRVar1;
  REF_CELL ref_cell;
  double dVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int *__ptr;
  REF_ADJ_ITEM pRVar6;
  REF_DBL *pRVar7;
  double *pdVar8;
  ulong uVar9;
  ulong uVar10;
  REF_DBL *pRVar11;
  undefined8 uVar12;
  long lVar13;
  REF_INT RVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  double *pdVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  char *pcVar23;
  int iVar24;
  bool bVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  double dVar33;
  ulong uStack_4b0;
  REF_INT degree;
  double *local_498;
  double *local_490;
  double local_488;
  uint local_47c;
  REF_DBL quality;
  REF_GRID local_470;
  REF_NODE local_468;
  long local_460;
  long local_458;
  long local_450;
  double local_448 [3];
  REF_DBL local_430;
  REF_DBL local_428;
  REF_DBL local_420;
  REF_DBL local_418;
  REF_INT local_410;
  int local_40c;
  long local_408;
  double local_400;
  double local_3f8;
  REF_INTERP local_3f0;
  ulong local_3e8;
  REF_BOOL allowed;
  double local_3d8;
  undefined8 uStack_3d0;
  REF_DBL d_quality [3];
  double local_3a8 [16];
  REF_DBL NtinvNNtN [16];
  REF_DBL NtinvNNt [16];
  REF_DBL NNt [16];
  REF_DBL N [16];
  REF_INT nodes [27];
  REF_DBL invNNt [16];
  
  ref_smooth_local_cell_about(ref_grid->cell[8],ref_grid->node,node,&allowed);
  if ((allowed != 0) &&
     ((local_3e8 = (ulong)(uint)node, node < 0 ||
      (((pRVar1 = ref_grid->cell[3]->ref_adj, pRVar1->nnode <= node ||
        (pRVar1->first[local_3e8] == -1)) &&
       ((pRVar1 = ref_grid->cell[6]->ref_adj, pRVar1->nnode <= node ||
        (pRVar1->first[local_3e8] == -1)))))))) {
    iVar3 = node * 0xf;
    local_460 = (long)iVar3;
    local_450 = (long)(iVar3 + 1);
    local_458 = (long)(iVar3 + 2);
    local_408 = (long)node;
    local_470 = ref_grid;
    for (local_40c = 0; local_40c != 100; local_40c = local_40c + 1) {
      local_468 = local_470->node;
      ref_cell = local_470->cell[8];
      quality = 0.0;
      local_3f0 = local_470->interp;
      local_410 = -1;
      if ((local_3f0 != (REF_INTERP)0x0) && (local_3f0->continuously != 0)) {
        local_410 = local_3f0->cell[local_408];
      }
      pRVar7 = local_468->real;
      local_428 = pRVar7[local_460];
      local_420 = pRVar7[local_450];
      local_418 = pRVar7[local_458];
      uVar4 = ref_adj_degree(ref_cell->ref_adj,node,&degree);
      RVar14 = degree;
      if (uVar4 != 0) {
        uStack_4b0 = (ulong)uVar4;
        pcVar23 = "deg";
        uVar12 = 0x802;
LAB_001d94a7:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
               uVar12,"ref_smooth_tet_nso_step",uStack_4b0,pcVar23);
        goto LAB_001d94b1;
      }
      lVar13 = (long)degree;
      if (lVar13 < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
               0x804,"ref_smooth_tet_nso_step","malloc cells of REF_INT negative");
        uStack_4b0 = 1;
        goto LAB_001d94b1;
      }
      __ptr = (int *)malloc(lVar13 * 4);
      if (__ptr == (int *)0x0) {
        pcVar23 = "malloc active of REF_INT NULL";
        uVar12 = 0x805;
LAB_001d95ad:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
               uVar12,"ref_smooth_tet_nso_step",pcVar23);
        uStack_4b0 = 2;
LAB_001d94b1:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
               0x8dd,"ref_smooth_tet_nso",uStack_4b0,"step");
        return (REF_STATUS)uStack_4b0;
      }
      local_490 = (double *)malloc(lVar13 * 8);
      if (local_490 == (double *)0x0) {
        pcVar23 = "malloc quals of REF_DBL NULL";
        uVar12 = 0x806;
        goto LAB_001d95ad;
      }
      local_498 = (double *)malloc((ulong)(uint)(RVar14 * 3) << 3);
      if (local_498 == (double *)0x0) {
        pcVar23 = "malloc grads of REF_DBL NULL";
        uVar12 = 0x807;
        goto LAB_001d95ad;
      }
      degree = 0;
      if (node < 0) {
        uVar26 = 0;
        uVar27 = 0x3ff00000;
        iVar3 = -1;
        uVar10 = 0xffffffff;
        RVar14 = -1;
        goto LAB_001d8966;
      }
      pRVar1 = ref_cell->ref_adj;
      if (pRVar1->nnode <= node) {
        uVar26 = 0;
        uVar27 = 0x3ff00000;
        iVar3 = -1;
        uVar10 = 0xffffffff;
        RVar14 = -1;
        goto LAB_001d8966;
      }
      iVar24 = pRVar1->first[local_3e8];
      uVar26 = 0;
      uVar27 = 0x3ff00000;
      uVar10 = 0xffffffff;
      RVar14 = -1;
      iVar3 = -1;
      if (iVar24 == -1) goto LAB_001d8966;
      pRVar6 = pRVar1->item;
      uVar26 = 0;
      uVar27 = 0x3ff00000;
      uVar10 = 0xffffffff;
LAB_001d8a51:
      RVar14 = pRVar6[iVar24].ref;
      iVar3 = iVar24;
LAB_001d8966:
      while( true ) {
        local_488 = (double)CONCAT44(uVar27,uVar26);
        iVar24 = (int)uVar10;
        if (iVar3 == -1) break;
        uVar4 = ref_cell_nodes(ref_cell,RVar14,nodes);
        if (uVar4 != 0) {
          uStack_4b0 = (ulong)uVar4;
          pcVar23 = "nodes";
          uVar12 = 0x80d;
          goto LAB_001d94a7;
        }
        uVar4 = ref_cell_orient_node0(4,node,nodes);
        if (uVar4 != 0) {
          uStack_4b0 = (ulong)uVar4;
          pcVar23 = "orient";
          uVar12 = 0x80e;
          goto LAB_001d94a7;
        }
        uVar4 = ref_node_tet_dquality_dnode0(local_468,nodes,&quality,d_quality);
        if (uVar4 != 0) {
          uStack_4b0 = (ulong)uVar4;
          pcVar23 = "qual";
          uVar12 = 0x810;
          goto LAB_001d94a7;
        }
        uVar26 = SUB84(quality,0);
        uVar27 = (undefined4)((ulong)quality >> 0x20);
        if (iVar24 != -1 && local_488 <= quality) {
          uVar26 = SUB84(local_488,0);
          uVar27 = (undefined4)((ulong)local_488 >> 0x20);
        }
        lVar13 = (long)degree;
        if (iVar24 == -1 || local_488 > quality) {
          uVar10 = (ulong)(uint)degree;
        }
        local_490[lVar13] = quality;
        local_498[lVar13 * 3] = d_quality[0];
        (local_498 + lVar13 * 3)[1] = d_quality[1];
        local_498[lVar13 * 3 + 2] = d_quality[2];
        degree = degree + 1;
        pRVar6 = ref_cell->ref_adj->item;
        iVar24 = pRVar6[iVar3].next;
        RVar14 = -1;
        iVar3 = iVar24;
        if (iVar24 != -1) goto LAB_001d8a51;
      }
      *__ptr = iVar24;
      uVar9 = (ulong)(uint)degree;
      if (degree < 1) {
        uVar9 = 0;
      }
      uVar15 = 0;
      uVar17 = 1;
      while( true ) {
        uVar4 = (uint)uVar17;
        lVar13 = (long)(int)uVar4;
        if (uVar9 == uVar15) break;
        if ((uVar10 != uVar15) && (local_490[uVar15] - local_490[*__ptr] < 1e-12)) {
          __ptr[lVar13] = (int)uVar15;
          uVar17 = (ulong)(uVar4 + 1);
        }
        uVar15 = uVar15 + 1;
      }
      if ((int)uVar4 < 4) {
        local_47c = uVar4;
        if (uVar4 == 1) {
          local_448[0] = local_498[iVar24 * 3];
          local_448[1] = (local_498 + iVar24 * 3)[1];
          local_448[2] = local_498[(long)(iVar24 * 3) + 2];
LAB_001d8af4:
          uVar4 = ref_math_normalize(local_448);
          if (uVar4 != 0) {
            uStack_4b0 = (ulong)uVar4;
            pcVar23 = "norm";
            uVar12 = 0x861;
            goto LAB_001d94a7;
          }
          lVar13 = (long)(iVar24 * 3);
          dVar2 = local_498[lVar13 + 2] * local_448[2] +
                  local_498[lVar13] * local_448[0] + local_498[lVar13 + 1] * local_448[1];
          if (dVar2 <= 0.0) {
            printf("%s: %d: %s: m0 not positive %e",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                   ,0x868,"ref_smooth_tet_nso_step");
            goto LAB_001d8f8b;
          }
          uVar10 = 0;
          if (0 < (int)local_47c) {
            uVar10 = (ulong)local_47c;
          }
          uVar9 = 0;
          if (0 < degree) {
            uVar9 = (ulong)(uint)degree;
          }
          uVar15 = 0xffffffffffffffff;
          dVar33 = 10000000000.0;
          for (uVar17 = 0; uVar17 != uVar9; uVar17 = uVar17 + 1) {
            bVar25 = false;
            for (uVar19 = 0; uVar10 != uVar19; uVar19 = uVar19 + 1) {
              if (uVar17 == (uint)__ptr[uVar19]) {
                bVar25 = true;
              }
            }
            dVar29 = dVar33;
            if (!bVar25) {
              dVar30 = (local_498[uVar17 * 3 + 2] * local_448[2] +
                       local_498[uVar17 * 3] * local_448[0] +
                       local_498[uVar17 * 3 + 1] * local_448[1]) - dVar2;
              auVar31._0_8_ = dVar30 * 1e+20;
              dVar28 = local_490[iVar24] - local_490[uVar17];
              auVar31._8_8_ = dVar28;
              auVar32._8_8_ = -dVar28;
              auVar32._0_8_ = -auVar31._0_8_;
              auVar32 = maxpd(auVar31,auVar32);
              if (auVar32._8_8_ < auVar32._0_8_) {
                dVar29 = dVar28 / dVar30;
                if (dVar29 < dVar33 && 0.0 < dVar29) {
                  uVar15 = uVar17;
                }
                uVar15 = uVar15 & 0xffffffff;
                if (dVar29 >= dVar33 || 0.0 >= dVar29) {
                  dVar29 = dVar33;
                }
              }
            }
            dVar33 = dVar29;
          }
          if ((int)uVar15 == -1) {
            dVar33 = (1.0 - *local_490) /
                     (local_498[2] * local_448[2] +
                     *local_498 * local_448[0] + local_498[1] * local_448[1]);
            pdVar8 = local_498 + 5;
            for (lVar13 = 1; lVar13 < degree; lVar13 = lVar13 + 1) {
              dVar29 = (1.0 - local_490[lVar13]) /
                       (*pdVar8 * local_448[2] +
                       pdVar8[-2] * local_448[0] + pdVar8[-1] * local_448[1]);
              if (dVar29 <= dVar33) {
                dVar33 = dVar29;
              }
              pdVar8 = pdVar8 + 3;
            }
          }
          local_430 = 0.0;
          uVar4 = 0;
          uStack_4b0 = 0;
          dVar29 = 0.0;
          uVar12 = 0;
          local_3f8 = dVar2;
          for (iVar3 = 0; iVar3 != 8; iVar3 = iVar3 + 1) {
            pRVar7 = local_468->real;
            pRVar7[local_460] = local_448[0] * dVar33 + local_428;
            pRVar7[local_450] = local_448[1] * dVar33 + local_420;
            pRVar7[local_458] = local_448[2] * dVar33 + local_418;
            local_400 = dVar29;
            local_3d8 = dVar33;
            uStack_3d0 = uVar12;
            uVar4 = ref_metric_interpolate_node(local_470,node);
            if ((uVar4 != 0) && (uVar4 != 5)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x89a,"ref_smooth_tet_nso_step",(ulong)uVar4);
              uStack_4b0 = (ulong)uVar4;
            }
            if ((uVar4 != 5) && (uVar4 != 0)) goto LAB_001d93e3;
            uVar5 = ref_smooth_tet_quality_around(local_470,node,&quality);
            if (uVar5 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x89c,"ref_smooth_tet_nso_step",(ulong)uVar5,"rep");
              uStack_4b0 = (ulong)uVar5;
              goto LAB_001d94b1;
            }
            if (((iVar3 != 0 && uVar4 == 0) && (quality < local_430)) && (local_488 < quality)) {
              quality = local_430;
              pRVar7 = local_468->real;
              pRVar7[local_460] = local_448[0] * local_400 + local_428;
              pRVar7[local_450] = local_448[1] * local_400 + local_420;
              pRVar7[local_458] = local_400 * local_448[2] + local_418;
              uVar4 = ref_metric_interpolate_node(local_470,node);
              if ((uVar4 != 0) && (uVar4 != 5)) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                       ,0x8ab,"ref_smooth_tet_nso_step",(ulong)uVar4);
                uStack_4b0 = (ulong)uVar4;
              }
              bVar25 = false;
              if ((uVar4 != 0) && (uVar4 != 5)) goto LAB_001d93e3;
LAB_001d93fd:
              if ((local_47c == 3) && (quality - local_488 < 1e-05)) goto LAB_001d8f8b;
              goto LAB_001d8f8e;
            }
            bVar25 = false;
            if ((local_3d8 * 0.9 * local_3f8 + local_490[iVar24] < quality) || (local_3d8 < 1e-12))
            goto LAB_001d93fd;
            dVar33 = local_3d8 * 0.5;
            dVar29 = local_3d8;
            uVar12 = uStack_3d0;
            local_430 = quality;
          }
          pRVar7 = local_468->real;
          pRVar7[local_460] = local_428;
          pRVar7[local_450] = local_420;
          pRVar7[local_458] = local_418;
          if ((uVar4 != 0) && (local_410 != -1)) {
            local_3f0->cell[local_408] = local_410;
          }
          uVar4 = ref_metric_interpolate_node(local_470,node);
          bVar25 = true;
          if ((uVar4 != 0) && (uVar4 != 5)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                   ,0x8bb,"ref_smooth_tet_nso_step",(ulong)uVar4);
            uStack_4b0 = (ulong)uVar4;
          }
          if ((uVar4 == 5) || (bVar25 = true, uVar4 == 0)) goto LAB_001d93fd;
LAB_001d93e3:
          if ((int)uStack_4b0 != 0) goto LAB_001d94b1;
          goto LAB_001d8fb2;
        }
        uVar10 = 0;
        if (0 < (int)uVar4) {
          uVar10 = uVar17;
        }
        pdVar8 = N + lVar13;
        for (uVar9 = 0; uVar9 != uVar10; uVar9 = uVar9 + 1) {
          N[uVar9] = 1.0;
          iVar3 = __ptr[uVar9];
          pdVar18 = pdVar8;
          for (lVar20 = 0; lVar20 != 3; lVar20 = lVar20 + 1) {
            *pdVar18 = -local_498[iVar3 * 3 + lVar20];
            pdVar18 = pdVar18 + lVar13;
          }
          pdVar8 = pdVar8 + 1;
        }
        pRVar7 = NNt;
        for (uVar9 = 0; uVar15 = uVar17, pRVar11 = pRVar7, uVar9 != uVar10; uVar9 = uVar9 + 1) {
          while (uVar15 != 0) {
            *pRVar11 = 0.0;
            uVar15 = uVar15 - 1;
            pRVar11 = pRVar11 + lVar13;
          }
          pRVar7 = pRVar7 + 1;
        }
        lVar20 = 0;
        for (uVar9 = 0; uVar9 != uVar10; uVar9 = uVar9 + 1) {
          lVar16 = 0;
          for (uVar15 = 0; uVar15 != uVar17; uVar15 = uVar15 + 1) {
            lVar21 = uVar15 * lVar13 + uVar9;
            dVar2 = NNt[lVar21];
            lVar22 = 4;
            pRVar7 = N;
            while (bVar25 = lVar22 != 0, lVar22 = lVar22 + -1, bVar25) {
              dVar2 = dVar2 + *(double *)((long)pRVar7 + lVar20) *
                              *(double *)((long)pRVar7 + lVar16);
              pRVar7 = pRVar7 + lVar13;
            }
            NNt[lVar21] = dVar2;
            lVar16 = lVar16 + 8;
          }
          lVar20 = lVar20 + 8;
        }
        uVar4 = ref_matrix_inv_gen(uVar4,NNt,invNNt);
        if (uVar4 == 0) {
          pRVar7 = NtinvNNt;
          for (lVar20 = 0; lVar20 != 4; lVar20 = lVar20 + 1) {
            for (lVar16 = 0; uVar10 << 5 != lVar16; lVar16 = lVar16 + 0x20) {
              *(undefined8 *)((long)pRVar7 + lVar16) = 0;
            }
            pRVar7 = pRVar7 + 1;
          }
          pRVar7 = N;
          for (lVar20 = 0; lVar20 != 4; lVar20 = lVar20 + 1) {
            pRVar11 = invNNt;
            for (uVar9 = 0; uVar9 != uVar10; uVar9 = uVar9 + 1) {
              lVar16 = lVar20 + uVar9 * 4;
              for (uVar15 = 0; uVar17 != uVar15; uVar15 = uVar15 + 1) {
                NtinvNNt[lVar16] = pRVar7[uVar15] * pRVar11[uVar15] + NtinvNNt[lVar16];
              }
              pRVar11 = pRVar11 + lVar13;
            }
            pRVar7 = pRVar7 + lVar13;
          }
          pRVar7 = NtinvNNtN;
          for (lVar20 = 0; lVar20 != 4; lVar20 = lVar20 + 1) {
            for (lVar16 = 0; lVar16 != 0x80; lVar16 = lVar16 + 0x20) {
              *(undefined8 *)((long)pRVar7 + lVar16) = 0;
            }
            pRVar7 = pRVar7 + 1;
          }
          pRVar7 = NtinvNNt;
          for (lVar20 = 0; lVar20 != 4; lVar20 = lVar20 + 1) {
            pRVar11 = N;
            for (lVar16 = 0; lVar16 != 4; lVar16 = lVar16 + 1) {
              lVar22 = lVar20 + lVar16 * 4;
              for (lVar21 = 0; uVar10 * 8 != lVar21; lVar21 = lVar21 + 8) {
                NtinvNNtN[lVar22] =
                     *(double *)((long)pRVar7 + lVar21 * 4) * *(double *)((long)pRVar11 + lVar21) +
                     NtinvNNtN[lVar22];
              }
              pRVar11 = pRVar11 + lVar13;
            }
            pRVar7 = pRVar7 + 1;
          }
          pdVar8 = local_3a8;
          pRVar7 = NtinvNNtN;
          for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
            for (lVar20 = 0; lVar20 != 0x80; lVar20 = lVar20 + 0x20) {
              *(ulong *)((long)pdVar8 + lVar20) =
                   *(ulong *)((long)pRVar7 + lVar20) ^ 0x8000000000000000;
            }
            pRVar7 = pRVar7 + 1;
            pdVar8 = pdVar8 + 1;
          }
          for (lVar13 = 0; lVar13 != 0xa0; lVar13 = lVar13 + 0x28) {
            *(double *)((long)local_3a8 + lVar13) = *(double *)((long)local_3a8 + lVar13) + 1.0;
          }
          for (lVar13 = 1; lVar13 != 4; lVar13 = lVar13 + 1) {
            local_448[lVar13 + -1] = local_3a8[lVar13];
          }
          goto LAB_001d8af4;
        }
        uStack_4b0 = (ulong)uVar4;
        pcVar23 = "inv";
        uVar12 = 0x848;
        goto LAB_001d94a7;
      }
LAB_001d8f8b:
      bVar25 = true;
LAB_001d8f8e:
      free(local_498);
      free(local_490);
      free(__ptr);
      if (bVar25) {
        return 0;
      }
LAB_001d8fb2:
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_smooth_tet_nso(REF_GRID ref_grid, REF_INT node) {
  REF_BOOL allowed, interior;
  REF_BOOL complete = REF_FALSE;
  REF_INT step;

  RSS(ref_smooth_local_cell_about(ref_grid_tet(ref_grid),
                                  ref_grid_node(ref_grid), node, &allowed),
      "para");
  if (!allowed) return REF_SUCCESS;

  interior = ref_cell_node_empty(ref_grid_tri(ref_grid), node) &&
             ref_cell_node_empty(ref_grid_qua(ref_grid), node);
  if (!interior) return REF_SUCCESS;

  for (step = 0; step < 100; step++) {
    RSS(ref_smooth_tet_nso_step(ref_grid, node, &complete), "step");
    if (complete) break;
  }

  return REF_SUCCESS;
}